

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O0

void ncnn::cast_bf16_to_fp32_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  __m128i v0;
  int *piVar2;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar3 [32];
  int i;
  float *outptr;
  unsigned_short *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  anon_union_4_2_947300b0 tmp;
  int iVar4;
  undefined1 in_stack_fffffffffffffd3c [12];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined4 local_2a0;
  long local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  undefined8 local_278;
  int *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined4 local_250;
  long local_248;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined8 local_228;
  undefined1 (*local_220) [16];
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  long *local_1f0;
  long *local_1e8;
  undefined1 local_1dd;
  int local_1dc;
  undefined8 *local_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined1 local_1a5;
  int local_1a4;
  undefined8 *local_198;
  undefined8 *local_188;
  undefined8 *local_158;
  undefined8 *local_148;
  undefined8 *local_108;
  undefined1 local_100 [32];
  int *local_d8;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  int *local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  undefined8 *local_a0;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined1 (*local_80) [16];
  undefined4 local_74;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined1 (*local_40) [16];
  int local_38;
  ushort local_32;
  
  local_1fc = *(int *)((long)in_RDI + 0x2c);
  local_200 = (int)in_RDI[6];
  local_204 = *(int *)((long)in_RDI + 0x34);
  local_208 = (int)in_RDI[7];
  local_20c = (int)in_RDI[3];
  local_210 = local_1fc * local_200 * local_204 * local_20c;
  local_1f0 = in_RSI;
  local_1e8 = in_RDI;
  for (local_214 = 0; local_214 < local_208; local_214 = local_214 + 1) {
    local_1d0 = &local_268;
    local_6c = *(int *)((long)local_1e8 + 0x2c);
    local_70 = (int)local_1e8[6];
    local_74 = *(undefined4 *)((long)local_1e8 + 0x34);
    local_220 = (undefined1 (*) [16])(*local_1e8 + local_1e8[8] * (long)local_214 * local_1e8[2]);
    local_88 = local_1e8[2];
    local_8c = (undefined4)local_1e8[3];
    local_98 = local_1e8[4];
    local_68 = &local_268;
    local_58 = (long)local_6c * (long)local_70 * local_88;
    local_108 = &local_268;
    local_1c0 = &local_268;
    local_198 = &local_2b8;
    local_a4 = *(int *)((long)local_1f0 + 0x2c);
    local_a8 = (int)local_1f0[6];
    local_ac = *(undefined4 *)((long)local_1f0 + 0x34);
    local_270 = (int *)(*local_1f0 + local_1f0[8] * (long)local_214 * local_1f0[2]);
    local_c0 = local_1f0[2];
    local_c4 = (undefined4)local_1f0[3];
    local_d0 = local_1f0[4];
    local_a0 = &local_2b8;
    local_48 = (long)local_a4 * (long)local_a8 * local_c0;
    local_188 = &local_2b8;
    local_1b8 = &local_2b8;
    local_230 = 0;
    local_234 = 0;
    local_238 = 0;
    local_23c = 0;
    local_250 = 0;
    local_258 = 0;
    local_260 = 0;
    local_268 = 0;
    local_4c = 0x10;
    local_5c = 0x10;
    local_1a4 = local_214;
    local_1a5 = 1;
    local_1dc = local_214;
    local_1dd = 1;
    local_228 = 0;
    local_240 = 0;
    local_2b8 = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_290 = 0;
    local_28c = 0;
    local_288 = 0;
    local_284 = 0;
    local_280 = 0;
    local_278 = 0;
    local_2b0 = 0;
    local_158 = local_1b8;
    local_148 = local_1c0;
    local_b8 = local_270;
    local_80 = local_220;
    local_298 = local_d0;
    local_248 = local_98;
    for (iVar4 = 0; piVar2 = local_270, iVar4 + 7 < local_210; iVar4 = iVar4 + 8) {
      local_40 = local_220;
      auVar1 = vlddqu_avx(*local_220);
      auVar3 = ZEXT1632(auVar1);
      v0._4_12_ = in_stack_fffffffffffffd3c;
      v0[0]._0_4_ = iVar4;
      bfloat2float_avx(v0);
      local_d8 = piVar2;
      local_100._0_8_ = auVar3._0_8_;
      local_100._8_8_ = auVar3._8_8_;
      local_100._16_8_ = auVar3._16_8_;
      local_100._24_8_ = auVar3._24_8_;
      *(undefined8 *)piVar2 = local_100._0_8_;
      *(undefined8 *)(piVar2 + 2) = local_100._8_8_;
      *(undefined8 *)(piVar2 + 4) = local_100._16_8_;
      *(undefined8 *)(piVar2 + 6) = local_100._24_8_;
      local_220 = local_220 + 1;
      local_270 = local_270 + 8;
      local_100 = auVar3;
    }
    for (; iVar4 < local_210; iVar4 = iVar4 + 1) {
      local_32 = *(ushort *)*local_220;
      local_38 = (uint)local_32 << 0x10;
      *local_270 = local_38;
      local_270 = local_270 + 1;
      local_220 = (undefined1 (*) [16])(*local_220 + 2);
    }
  }
  return;
}

Assistant:

static void cast_bf16_to_fp32_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_bf16_to_fp32_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned short* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        int i = 0;
#if __AVX512BF16__
        for (; i + 15 < size; i += 16)
        {
            __m256bh _v_bf16 = (__m256bh)_mm256_loadu_si256((const __m256i*)ptr);
            __m512 _v_fp32 = _mm512_cvtpbh_ps(_v_bf16);
            _mm512_storeu_ps(outptr, _v_fp32);

            ptr += 16;
            outptr += 16;
        }
        for (; i + 7 < size; i += 8)
        {
            __m128bh _v_bf16 = (__m128bh)_mm_loadu_si128((const __m128i*)ptr);
            __m256 _v_fp32 = _mm256_cvtpbh_ps(_v_bf16);
            _mm256_storeu_ps(outptr, _v_fp32);

            ptr += 8;
            outptr += 8;
        }
#elif __AVX__
        for (; i + 7 < size; i += 8)
        {
            _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_lddqu_si128((__m128i const*)ptr)));
            ptr += 8;
            outptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            *outptr++ = bfloat16_to_float32(*ptr++);
        }
    }
}